

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O2

int lsrkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  ARKodeLSRKStepMem step_mem;
  
  iVar1 = lsrkStep_AccessStepMem(ark_mem,"lsrkStep_FullRHS",&step_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (mode == 2) {
    iVar1 = (*step_mem->fe)(t,y,f,ark_mem->user_data);
    step_mem->nfe = step_mem->nfe + 1;
    if (iVar1 != 0) {
      iVar1 = 0x1bb;
      goto LAB_001446b2;
    }
  }
  else {
    if (mode != 1) {
      if (mode != 0) {
        arkProcessError(ark_mem,-8,0x1c4,"lsrkStep_FullRHS",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                        ,"Unknown full RHS mode");
        return -8;
      }
      if (ark_mem->fn_is_current != 0) {
        return 0;
      }
      iVar1 = (*step_mem->fe)(t,y,f,ark_mem->user_data);
      step_mem->nfe = step_mem->nfe + 1;
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = 0x197;
LAB_001446b2:
      arkProcessError(ark_mem,-8,iVar1,"lsrkStep_FullRHS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep.c"
                      ,
                      "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                      ,t);
      return -8;
    }
    if (step_mem->is_SSP != 0) {
      iVar1 = (*step_mem->fe)(t,y,ark_mem->fn,ark_mem->user_data);
      step_mem->nfe = step_mem->nfe + 1;
      ark_mem->fn_is_current = 1;
      if (iVar1 != 0) {
        iVar1 = 0x1ab;
        goto LAB_001446b2;
      }
    }
    N_VScale(0x3ff0000000000000,ark_mem->fn,f);
  }
  return 0;
}

Assistant:

int lsrkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                     int mode)
{
  int retval;
  ARKodeLSRKStepMem step_mem;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:

    /* compute the RHS */
    if (!ark_mem->fn_is_current)
    {
      retval = step_mem->fe(t, y, f, ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return ARK_RHSFUNC_FAIL;
      }
    }

    break;

  case ARK_FULLRHS_END:
    /* No further action is needed if STS since the currently available STS methods
       evaluate the RHS at the end of each time step. If the stepper is an SSP, fn is
       updated and reused at the beginning of the step unless
       ark_mem->fn_is_current is changed by ARKODE. */
    if (step_mem->is_SSP)
    {
      retval = step_mem->fe(t, y, ark_mem->fn, ark_mem->user_data);
      step_mem->nfe++;
      ark_mem->fn_is_current = SUNTRUE;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return ARK_RHSFUNC_FAIL;
      }
    }
    N_VScale(ONE, ark_mem->fn, f);

    break;

  case ARK_FULLRHS_OTHER:

    /* call f */
    retval = step_mem->fe(t, y, f, ark_mem->user_data);
    step_mem->nfe++;
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return ARK_RHSFUNC_FAIL;
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return ARK_RHSFUNC_FAIL;
  }

  return ARK_SUCCESS;
}